

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

string * __thiscall
cfd::core::Privkey::SignBitcoinMessageWithBase64
          (string *__return_storage_ptr__,Privkey *this,string *message)

{
  ByteData local_38;
  string *local_20;
  string *message_local;
  Privkey *this_local;
  
  local_20 = message;
  message_local = (string *)this;
  this_local = (Privkey *)__return_storage_ptr__;
  SignBitcoinMessage(&local_38,this,message);
  CryptoUtil::EncodeBase64_abi_cxx11_((CryptoUtil *)__return_storage_ptr__,&local_38);
  ByteData::~ByteData((ByteData *)0x473bec);
  return __return_storage_ptr__;
}

Assistant:

std::string Privkey::SignBitcoinMessageWithBase64(
    const std::string &message) const {
  return CryptoUtil::EncodeBase64(SignBitcoinMessage(message));
}